

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.yy.cpp
# Opt level: O0

YY_BUFFER_STATE yy_scan_bytes(char *yybytes,int _yybytes_len,yyscan_t yyscanner)

{
  char *msg;
  char *base;
  YY_BUFFER_STATE pyVar1;
  int in_ESI;
  long in_RDI;
  int i;
  yy_size_t n;
  char *buf;
  YY_BUFFER_STATE b;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  
  msg = (char *)(long)(in_ESI + 2);
  base = (char *)yyalloc((yy_size_t)msg,
                         (yyscan_t)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (base == (char *)0x0) {
    yy_fatal_error(msg,(yyscan_t)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
    base[iVar2] = *(char *)(in_RDI + iVar2);
  }
  base[in_ESI + 1] = '\0';
  base[in_ESI] = '\0';
  pyVar1 = yy_scan_buffer(base,(yy_size_t)msg,(yyscan_t)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  if (pyVar1 == (YY_BUFFER_STATE)0x0) {
    yy_fatal_error(msg,(yyscan_t)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  }
  pyVar1->yy_is_our_buffer = 1;
  return pyVar1;
}

Assistant:

YY_BUFFER_STATE yy_scan_bytes  (const char * yybytes, int  _yybytes_len , yyscan_t yyscanner)
{
	YY_BUFFER_STATE b;
	char *buf;
	yy_size_t n;
	int i;
    
	/* Get memory for full buffer, including space for trailing EOB's. */
	n = (yy_size_t) (_yybytes_len + 2);
	buf = (char *) yyalloc( n , yyscanner );
	if ( ! buf )
		YY_FATAL_ERROR( "out of dynamic memory in yy_scan_bytes()" );

	for ( i = 0; i < _yybytes_len; ++i )
		buf[i] = yybytes[i];

	buf[_yybytes_len] = buf[_yybytes_len+1] = YY_END_OF_BUFFER_CHAR;

	b = yy_scan_buffer( buf, n , yyscanner);
	if ( ! b )
		YY_FATAL_ERROR( "bad buffer in yy_scan_bytes()" );

	/* It's okay to grow etc. this buffer, and we should throw it
	 * away when we're done.
	 */
	b->yy_is_our_buffer = 1;

	return b;
}